

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a5 [13];
  string *local_98;
  string local_90;
  string local_70;
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  int *args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_98 = &local_90;
  local_28 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (int *)format;
  format_local = (char *)this;
  ToString<int,void>(local_98,(Formatter *)(ulong)(uint)*args,(int)args);
  local_98 = &local_70;
  ToString(local_98,local_28);
  local_50 = &local_90;
  local_48 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_a5);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,__l,local_a5);
  io::Printer::FormatInternal(this_00,&local_40,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_a5);
  local_c8 = (string *)&local_50;
  do {
    local_c8 = local_c8 + -1;
    std::__cxx11::string::~string((string *)local_c8);
  } while (local_c8 != &local_90);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }